

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

Arg * __thiscall
fmt::internal::FormatterBase::get_arg
          (Arg *__return_storage_ptr__,FormatterBase *this,uint arg_index,char **error)

{
  if (this->next_arg_index_ < 1) {
    this->next_arg_index_ = -1;
    do_get_arg(__return_storage_ptr__,this,arg_index,error);
  }
  else {
    *error = "cannot switch from automatic to manual argument indexing";
    *(undefined8 *)&__return_storage_ptr__->type = 0;
    *(undefined8 *)&__return_storage_ptr__->field_0x18 = 0;
    (__return_storage_ptr__->super_Value).field_0.long_long_value = 0;
    (__return_storage_ptr__->super_Value).field_0.string.size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Arg get_arg(unsigned arg_index, const char *&error) {
    return check_no_auto_index(error) ? do_get_arg(arg_index, error) : Arg();
  }